

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

lock_guard<std::recursive_mutex> * __thiscall rcg::System::getName_abi_cxx11_(System *this)

{
  lock_guard<std::recursive_mutex> *in_RDI;
  lock_guard<std::recursive_mutex> lock;
  TL_INFO_CMD in_stack_0000040c;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000410;
  TL_HANDLE in_stack_00000418;
  mutex_type *in_stack_ffffffffffffffb8;
  
  std::lock_guard<std::recursive_mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffb8);
  (anonymous_namespace)::cTLGetInfo_abi_cxx11_
            (in_stack_00000418,in_stack_00000410,in_stack_0000040c);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x11014b);
  return in_RDI;
}

Assistant:

std::string System::getName()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  return cTLGetInfo(tl, gentl, GenTL::TL_INFO_NAME);
}